

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  SBuf *sb;
  uint uVar1;
  int *piVar2;
  int iVar3;
  GCstr *pGVar4;
  cTValue *pcVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  iVar10 = -left;
  if (0 < left) {
    iVar10 = left;
  }
  do {
    uVar1 = (top->field_2).it;
    if ((uVar1 != 0xfffffffb && 0xfffeffff < uVar1) ||
       (0xfffeffff < *(uint *)((long)top + -4) && *(uint *)((long)top + -4) != 0xfffffffb)) {
      pcVar5 = lj_meta_lookup(L,top + -1,MM_concat);
      if (((pcVar5->field_2).it == 0xffffffff) &&
         (pcVar5 = lj_meta_lookup(L,top,MM_concat), (pcVar5->field_2).it == 0xffffffff)) {
        lj_err_optype(L,top + ((ulong)(*(uint *)((long)top + -4) < 0xffff0000 ||
                                      *(uint *)((long)top + -4) == 0xfffffffb) - 1),LJ_ERR_OPCAT);
      }
      top[1] = top[-1];
      top[2].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)top;
      *top = *pcVar5;
      top[-1].n = 3.83345534608223e-320;
      return top + 1;
    }
    uVar8 = 0x20;
    if (uVar1 == 0xfffffffb) {
      uVar8 = (ulong)*(uint *)((ulong)(top->u32).lo + 0xc);
    }
    iVar3 = 1;
    if (iVar10 < 1) {
      iVar3 = iVar10;
    }
    piVar2 = (int *)((long)top + -4);
    do {
      iVar9 = iVar10;
      piVar6 = piVar2;
      uVar7 = 0x20;
      if (*piVar6 == -5) {
        uVar7 = (ulong)*(uint *)((ulong)(uint)piVar6[-1] + 0xc);
      }
      uVar8 = uVar8 + uVar7;
      iVar10 = iVar3 + -1;
      if (iVar9 < 2) break;
      iVar10 = iVar9 + -1;
      piVar2 = piVar6 + -2;
    } while ((uint)piVar6[-2] < 0xffff0000 || piVar6[-2] == 0xfffffffb);
    if (0x7ffffeff < uVar8) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    uVar7 = (ulong)(L->glref).ptr32;
    sb = (SBuf *)(uVar7 + 0xe8);
    *(int *)(uVar7 + 0xf4) = (int)L;
    *(int *)(uVar7 + 0xe8) = *(int *)(uVar7 + 0xf0);
    if ((uint)(*(int *)(uVar7 + 0xec) - *(int *)(uVar7 + 0xf0)) < (uint)uVar8) {
      lj_buf_more2(sb,(uint)uVar8);
    }
    for (pcVar5 = (cTValue *)(piVar6 + -1); pcVar5 <= top; pcVar5 = pcVar5 + 1) {
      if ((pcVar5->field_2).it == 0xfffffffb) {
        lj_buf_putmem(sb,(void *)((ulong)(pcVar5->u32).lo + 0x10),
                      *(MSize *)((ulong)(pcVar5->u32).lo + 0xc));
      }
      else {
        lj_strfmt_putfnum(sb,0xf000035,pcVar5->n);
      }
    }
    pGVar4 = lj_str_new(L,(char *)(ulong)*(uint *)(uVar7 + 0xf0),
                        (ulong)(*(int *)(uVar7 + 0xe8) - *(uint *)(uVar7 + 0xf0)));
    piVar6[-1] = (int)pGVar4;
    *piVar6 = -5;
    top = (cTValue *)(piVar6 + -1);
    if (iVar9 < 2) {
      uVar8 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar8 + 0x54) <= *(uint *)(uVar8 + 0x50)) {
        lj_meta_cat_cold_1();
      }
      return (TValue *)0x0;
    }
  } while( true );
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    if (!(tvisstr(top) || tvisnumber(top)) ||
	!(tvisstr(top-1) || tvisnumber(top-1))) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2*LJ_FR2+2, top);  /* Carefully ordered stack copies! */
      copyTV(L, top+2*LJ_FR2+1, top-1);
      copyTV(L, top+LJ_FR2, mo);
      setcont(top-1, lj_cont_cat);
      if (LJ_FR2) { setnilV(top); setnilV(top+2); top += 2; }
      return top+1;  /* Trigger metamethod call. */
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      TValue *e, *o = top;
      uint64_t tlen = tvisstr(o) ? strV(o)->len : STRFMT_MAXBUF_NUM;
      SBuf *sb;
      do {
	o--; tlen += tvisstr(o) ? strV(o)->len : STRFMT_MAXBUF_NUM;
      } while (--left > 0 && (tvisstr(o-1) || tvisnumber(o-1)));
      if (tlen >= LJ_MAX_STR) lj_err_msg(L, LJ_ERR_STROV);
      sb = lj_buf_tmp_(L);
      lj_buf_more(sb, (MSize)tlen);
      for (e = top, top = o; o <= e; o++) {
	if (tvisstr(o)) {
	  GCstr *s = strV(o);
	  MSize len = s->len;
	  lj_buf_putmem(sb, strdata(s), len);
	} else if (tvisint(o)) {
	  lj_strfmt_putint(sb, intV(o));
	} else {
	  lj_strfmt_putfnum(sb, STRFMT_G14, numV(o));
	}
      }
      setstrV(L, top, lj_buf_str(L, sb));
    }
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}